

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O2

PosFilter *
indirect_filter(PosFilter *__return_storage_ptr__,Ray *r,Random *rng,int depth,int maxdepth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  pointer pSVar5;
  Random *this;
  bool bVar6;
  long lVar7;
  double dVar8;
  int id;
  double pdf;
  double t;
  Vector v_1;
  Vector n;
  Vector v_2;
  Vector v;
  Vector wi;
  Vector e;
  double dStack_180;
  int local_15c;
  double local_158;
  Random *local_150;
  double local_148;
  double local_140;
  undefined1 local_138 [16];
  double local_128;
  double local_118;
  double dStack_110;
  Vector local_108;
  Vector local_e8;
  PosFilter local_c8;
  Vector local_98;
  Vector local_80;
  Ray local_68;
  
  local_15c = 0;
  bVar6 = Intersect(&spheres,r,&local_140,&local_15c);
  pSVar5 = spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar6) {
    lVar7 = (long)local_15c;
    local_118 = local_140 * (r->d).x + (r->o).x;
    dStack_110 = local_140 * (r->d).y + (r->o).y;
    local_158 = (r->d).z * local_140 + (r->o).z;
    dVar4 = dStack_110 -
            spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7].c.y;
    local_c8.first.y._0_4_ = SUB84(dVar4,0);
    local_c8.first.x =
         local_118 -
         spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
         ._M_start[lVar7].c.x;
    local_c8.first.y._4_4_ = (int)((ulong)dVar4 >> 0x20);
    local_c8.first.z =
         local_158 -
         spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data
         ._M_start[lVar7].c.z;
    local_150 = rng;
    Vector::Normalize(&local_108,&local_c8.first);
    this = local_150;
    if (0.0 <= (r->d).z * local_108.z + (r->d).x * local_108.x + local_108.y * (r->d).y) {
      local_138._8_4_ = SUB84(local_108.y,0);
      local_138._0_8_ = -local_108.x;
      local_138._12_4_ = (uint)((ulong)local_108.y >> 0x20) ^ 0x80000000;
      local_128 = -local_108.z;
    }
    else {
      local_128 = local_108.z;
      local_138._8_8_ = local_108.y;
      local_138._0_8_ = local_108.x;
    }
    if (depth < maxdepth) {
      dVar4 = Random::operator()(local_150);
      dVar8 = Random::operator()(this);
      local_80.z = Random::operator()(this);
      local_e8.x._0_4_ = *(undefined4 *)&(r->d).x;
      local_e8.y._0_4_ = *(undefined4 *)&(r->d).y;
      local_e8.x._4_4_ = *(uint *)((long)&(r->d).x + 4) ^ 0x80000000;
      local_e8.y._4_4_ = *(uint *)((long)&(r->d).y + 4) ^ 0x80000000;
      local_e8.z = -(r->d).z;
      local_80.x = dVar4;
      local_80.y = dVar8;
      Material::Sample(&local_98,&pSVar5[lVar7].mat,&local_e8,(Vector *)local_138,&local_80,
                       &local_148);
      dVar4 = local_98.z * local_128 +
              local_98.x * (double)local_138._0_8_ + local_98.y * (double)local_138._8_8_;
      Material::Reflectance
                (&local_c8.first,&pSVar5[lVar7].mat,&local_98,&local_e8,(Vector *)local_138);
      dVar8 = local_c8.first.z * dVar4;
      dVar3 = dVar4 * local_c8.first.x;
      auVar1._8_4_ = SUB84(dVar4 * local_c8.first.y,0);
      auVar1._0_8_ = dVar3;
      auVar1._12_4_ = (int)((ulong)(dVar4 * local_c8.first.y) >> 0x20);
      local_68.o.x = local_118;
      local_68.o.y = dStack_110;
      local_68.o.z = local_158;
      local_68.d.x = local_98.x;
      local_68.d.y = local_98.y;
      local_68.d.z = local_98.z;
      indirect_filter(&local_c8,&local_68,this,depth + 1,maxdepth);
      local_148 = 1.0 / local_148;
      dStack_180 = auVar1._8_8_;
      dVar8 = dVar8 * local_c8.second.z * local_148;
      dVar4 = local_148 * local_c8.second.x * dVar3;
      local_148 = local_148 * local_c8.second.y * dStack_180;
      (__return_storage_ptr__->first).z = local_c8.first.z;
      (__return_storage_ptr__->first).x = local_c8.first.x;
      (__return_storage_ptr__->first).y = local_c8.first.y;
    }
    else {
      (__return_storage_ptr__->first).x = local_118;
      (__return_storage_ptr__->first).y = dStack_110;
      (__return_storage_ptr__->first).z = local_158;
      dVar4 = 1.0;
      local_148 = 1.0;
      dVar8 = 1.0;
    }
    auVar2._8_4_ = SUB84(local_148,0);
    auVar2._0_8_ = dVar4;
    auVar2._12_4_ = (int)((ulong)local_148 >> 0x20);
    (__return_storage_ptr__->second).x = dVar4;
    (__return_storage_ptr__->second).y = (double)auVar2._8_8_;
    (__return_storage_ptr__->second).z = dVar8;
  }
  else {
    (__return_storage_ptr__->second).y = 0.0;
    (__return_storage_ptr__->second).z = 0.0;
    (__return_storage_ptr__->first).z = 0.0;
    (__return_storage_ptr__->second).x = 0.0;
    (__return_storage_ptr__->first).x = 0.0;
    (__return_storage_ptr__->first).y = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

PosFilter indirect_filter(const Ray &r, Random& rng, int depth, int maxdepth=2){
   double t;                               // distance to Intersection
   int id=0;                               // id of Intersected object
   if (!Intersect(spheres, r, t, id)) return PosFilter(Vector(), Vector()); // if miss, return black
   const Sphere&   obj = spheres[id];      // the hit object
   const Material& mat = obj.mat;          // Its material
   Vector x  = r.o+r.d*t,
          n  = (x-obj.c).Normalize(),
          nl = Vector::Dot(n,r.d) < 0 ? n:n*-1;

   // Once you reach the max depth, return the hit position and the filter's
   // value using the recursive form.
   if(depth >= maxdepth) {
      return PosFilter(x, Vector(1.0f, 1.0f, 1.0f));

   // Main covariance computation. First this code generate a new direction
   // and query the covariance+radiance in that direction. Then, it computes
   // the covariance after the reflection/refraction.
   } else {
      /* Sampling a new direction + recursive call */
      double pdf;
      const auto e   = Vector(rng(), rng(), rng());
      const auto wo  = -r.d;
      const auto wi  = mat.Sample(wo, nl, e, pdf);
            auto f   = Vector::Dot(wi, nl)*mat.Reflectance(wi, wo, nl);
      const auto res = indirect_filter(Ray(x, wi), rng, depth+1, maxdepth);
      return PosFilter(res.first, (1.f/pdf) * f.Multiply(res.second));
   }
}